

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O3

void __thiscall TestChain100Setup::mineBlocks(TestChain100Setup *this,int num_blocks)

{
  uint uVar1;
  uint uVar2;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  int64_t iVar3;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar4;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b_00;
  CBlock b;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> noTxns;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  uchar local_e9;
  CBlock local_e8;
  undefined1 local_78 [28];
  uint uStack_5c;
  direct_or_indirect local_58;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._16_8_ = 0;
  stack0xffffffffffffffa0 = 0;
  local_78._0_8_ = (char *)0x0;
  local_78._8_8_ = 0;
  CKey::GetPubKey((CPubKey *)&local_e8,&this->coinbaseKey);
  ToByteVector<CPubKey>(&local_108,(CPubKey *)&local_e8);
  b_00._M_extent._M_extent_value =
       (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  b_00._M_ptr = local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  this_00 = &CScript::operator<<((CScript *)local_78,b_00)->super_CScriptBase;
  uVar1 = this_00->_size;
  uVar2 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar2 = uVar1;
  }
  ppVar4 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
           (this_00->_union).indirect_contents.indirect;
  if (uVar1 < 0x1d) {
    ppVar4 = this_00;
  }
  local_e9 = 0xac;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
            (this_00,(uchar *)((long)&ppVar4->_union + (long)(int)uVar2),&local_e9);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,this_00
            );
  if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (0x1c < uStack_5c) {
    free((void *)local_78._0_8_);
  }
  if (0 < num_blocks) {
    do {
      local_78._0_8_ = (char *)0x0;
      local_78._8_8_ = 0;
      local_78._16_8_ = 0;
      CreateAndProcessBlock
                (&local_e8,this,
                 (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)local_78,
                 (CScript *)&local_58.indirect_contents,(Chainstate *)0x0);
      iVar3 = GetTime();
      SetMockTime(iVar3 + 1);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::push_back(&this->m_coinbase_txns,
                  local_e8.vtx.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(&local_e8.vtx);
      std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
                ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)local_78);
      num_blocks = num_blocks + -1;
    } while (num_blocks != 0);
  }
  if (0x1c < local_3c) {
    free(local_58.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestChain100Setup::mineBlocks(int num_blocks)
{
    CScript scriptPubKey = CScript() << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;
    for (int i = 0; i < num_blocks; i++) {
        std::vector<CMutableTransaction> noTxns;
        CBlock b = CreateAndProcessBlock(noTxns, scriptPubKey);
        SetMockTime(GetTime() + 1);
        m_coinbase_txns.push_back(b.vtx[0]);
    }
}